

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void cmGlobalNinjaGenerator::WriteRule(ostream *os,cmNinjaRule *rule)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char local_11;
  
  if ((rule->Name)._M_string_length == 0) {
    std::operator+(&local_38,"No name given for WriteRule! called with comment: ",&rule->Comment);
    cmSystemTools::Error(&local_38);
  }
  else if ((rule->Command)._M_string_length == 0) {
    std::operator+(&local_38,"No command given for WriteRule! called with comment: ",&rule->Comment)
    ;
    cmSystemTools::Error(&local_38);
  }
  else {
    if (((rule->RspFile)._M_string_length == 0) || ((rule->RspContent)._M_string_length != 0)) {
      WriteComment(os,&rule->Comment);
      std::__ostream_insert<char,std::char_traits<char>>(os,"rule ",5);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(rule->Name)._M_dataplus._M_p,(rule->Name)._M_string_length);
      local_38._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_38,1);
      if ((rule->DepFile)._M_string_length != 0) {
        Indent(os,1);
        std::__ostream_insert<char,std::char_traits<char>>(os,"depfile",7);
        std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(rule->DepFile)._M_dataplus._M_p,(rule->DepFile)._M_string_length);
        local_38._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_38,1);
      }
      if ((rule->DepType)._M_string_length != 0) {
        Indent(os,1);
        std::__ostream_insert<char,std::char_traits<char>>(os,"deps",4);
        std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(rule->DepType)._M_dataplus._M_p,(rule->DepType)._M_string_length);
        local_38._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_38,1);
      }
      if ((rule->Command)._M_string_length != 0) {
        Indent(os,1);
        std::__ostream_insert<char,std::char_traits<char>>(os,"command",7);
        std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(rule->Command)._M_dataplus._M_p,(rule->Command)._M_string_length);
        local_38._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_38,1);
      }
      if ((rule->Description)._M_string_length != 0) {
        Indent(os,1);
        std::__ostream_insert<char,std::char_traits<char>>(os,"description",0xb);
        std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(rule->Description)._M_dataplus._M_p,
                            (rule->Description)._M_string_length);
        local_38._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_38,1);
      }
      if ((rule->RspFile)._M_string_length != 0) {
        Indent(os,1);
        std::__ostream_insert<char,std::char_traits<char>>(os,"rspfile",7);
        std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(rule->RspFile)._M_dataplus._M_p,(rule->RspFile)._M_string_length);
        local_38._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_38,1);
        if ((rule->RspContent)._M_string_length != 0) {
          Indent(os,1);
          std::__ostream_insert<char,std::char_traits<char>>(os,"rspfile_content",0xf);
          std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,(rule->RspContent)._M_dataplus._M_p,
                              (rule->RspContent)._M_string_length);
          local_38._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_38,1);
        }
      }
      if ((rule->Restat)._M_string_length != 0) {
        Indent(os,1);
        std::__ostream_insert<char,std::char_traits<char>>(os,"restat",6);
        std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(rule->Restat)._M_dataplus._M_p,(rule->Restat)._M_string_length);
        local_38._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_38,1);
      }
      if (rule->Generator == true) {
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"1","");
        if (local_38._M_string_length != 0) {
          Indent(os,1);
          std::__ostream_insert<char,std::char_traits<char>>(os,"generator",9);
          std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,local_38._M_dataplus._M_p,local_38._M_string_length);
          local_11 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_11,1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
      }
      local_38._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_38,1);
      return;
    }
    std::operator+(&local_38,
                   "rspfile but no rspfile_content given for WriteRule! called with comment: ",
                   &rule->Comment);
    cmSystemTools::Error(&local_38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteRule(std::ostream& os,
                                       cmNinjaRule const& rule)
{
  // -- Parameter checks
  // Make sure the rule has a name.
  if (rule.Name.empty()) {
    cmSystemTools::Error("No name given for WriteRule! called with comment: " +
                         rule.Comment);
    return;
  }

  // Make sure a command is given.
  if (rule.Command.empty()) {
    cmSystemTools::Error(
      "No command given for WriteRule! called with comment: " + rule.Comment);
    return;
  }

  // Make sure response file content is given
  if (!rule.RspFile.empty() && rule.RspContent.empty()) {
    cmSystemTools::Error("rspfile but no rspfile_content given for WriteRule! "
                         "called with comment: " +
                         rule.Comment);
    return;
  }

  // -- Write rule
  // Write rule intro
  cmGlobalNinjaGenerator::WriteComment(os, rule.Comment);
  os << "rule " << rule.Name << '\n';

  // Write rule key/value pairs
  auto writeKV = [&os](const char* key, std::string const& value) {
    if (!value.empty()) {
      cmGlobalNinjaGenerator::Indent(os, 1);
      os << key << " = " << value << '\n';
    }
  };

  writeKV("depfile", rule.DepFile);
  writeKV("deps", rule.DepType);
  writeKV("command", rule.Command);
  writeKV("description", rule.Description);
  if (!rule.RspFile.empty()) {
    writeKV("rspfile", rule.RspFile);
    writeKV("rspfile_content", rule.RspContent);
  }
  writeKV("restat", rule.Restat);
  if (rule.Generator) {
    writeKV("generator", "1");
  }

  // Finish rule
  os << '\n';
}